

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapScriptFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  FunctionBody *proxy;
  ScriptFunction *pSVar2;
  ScriptFunctionWithInlineCache *this_00;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag != SnapScriptFunctionObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  proxy = InflateMap::LookupFunctionBody
                    (inflator,*(TTD_PTR_ID *)((long)snpObject->AddtlSnapObjectInfo + 0x10));
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if ((proxy->field_0x17a & 8) == 0) {
    pSVar2 = Js::JavascriptLibrary::CreateScriptFunction(this,(FunctionProxy *)proxy);
    return (RecyclableObject *)pSVar2;
  }
  this_00 = Js::JavascriptLibrary::CreateScriptFunctionWithInlineCache(this,(FunctionProxy *)proxy);
  Js::ScriptFunctionWithInlineCache::CreateInlineCache(this_00);
  return (RecyclableObject *)this_00;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapScriptFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapScriptFunctionInfo* snapFuncInfo = SnapObjectGetAddtlInfoAs<SnapScriptFunctionInfo*, SnapObjectType::SnapScriptFunctionObject>(snpObject);

            Js::FunctionBody* fbody = inflator->LookupFunctionBody(snapFuncInfo->BodyRefId);

            Js::ScriptFunction* func = nullptr;
            if(!fbody->GetInlineCachesOnFunctionObject())
            {
                func = ctx->GetLibrary()->CreateScriptFunction(fbody);
            }
            else
            {
                Js::ScriptFunctionWithInlineCache* ifunc = ctx->GetLibrary()->CreateScriptFunctionWithInlineCache(fbody);
                ifunc->CreateInlineCache();

                func = ifunc;
            }

            return func;
        }